

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void removeRowsOfCountOne(HighsLogOptions *log_options,HighsLp *lp)

{
  vector<double,_std::allocator<double>_> *this;
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  size_type __new_size;
  ulong __new_size_00;
  ulong uVar16;
  long lVar17;
  int iVar18;
  HighsInt iRow;
  double dVar19;
  double dVar20;
  double dVar21;
  value_type_conflict2 local_4bc;
  uint local_4b8;
  uint local_4b4;
  vector<int,_std::allocator<int>_> *local_4b0;
  vector<int,_std::allocator<int>_> ar_start;
  vector<int,_std::allocator<int>_> ar_index;
  vector<double,_std::allocator<double>_> ar_value;
  vector<int,_std::allocator<int>_> a_count;
  vector<int,_std::allocator<int>_> ar_count;
  HighsLp row_wise_lp;
  
  HighsLp::HighsLp(&row_wise_lp,lp);
  a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pbVar4 = (lp->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar5 = (lp->row_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = (size_type)
               (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lp->num_col_];
  local_4bc = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&ar_count,(long)lp->num_row_,&local_4bc);
  local_4b0 = &(lp->a_matrix_).index_;
  this = &(lp->a_matrix_).value_;
  piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = 0;
  while (lVar13 < lp->num_col_) {
    piVar1 = piVar6 + lVar13;
    lVar13 = lVar13 + 1;
    piVar7 = (local_4b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = (long)*piVar1; lVar14 < piVar6[lVar13]; lVar14 = lVar14 + 1) {
      ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar7[lVar14]] =
           ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar7[lVar14]] + 1;
    }
  }
  local_4bc = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ar_start,&local_4bc);
  for (lVar13 = 0; lVar13 < lp->num_row_; lVar13 = lVar13 + 1) {
    local_4bc = ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13] +
                ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar13];
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&ar_start,&local_4bc);
    ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar13] = ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar13];
  }
  std::vector<int,_std::allocator<int>_>::resize(&ar_index,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&ar_value,__new_size);
  piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = 0;
  while (lVar14 = lVar13, lVar14 < lp->num_col_) {
    piVar7 = (local_4b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar17 = (long)piVar6[lVar14]; lVar13 = lVar14 + 1, lVar17 < piVar6[lVar14 + 1];
        lVar17 = lVar17 + 1) {
      iVar2 = piVar7[lVar17];
      ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2]] = (int)lVar14;
      iVar18 = ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
      ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar18] = pdVar8[lVar17];
      ar_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar2] = iVar18 + 1;
    }
  }
  local_4b8 = 0;
  lVar14 = 0;
  local_4b4 = 0;
  lVar13 = 0;
  do {
    uVar12 = local_4b4;
    iVar2 = lp->num_row_;
    pdVar8 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar17 = 0;
    while( true ) {
      uVar16 = (ulong)local_4b4;
      __new_size_00 = (ulong)local_4b8;
      iVar18 = (int)lVar14;
      if ((long)iVar2 <= lVar13 + lVar17) {
        ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[__new_size_00] = iVar18;
        lp->num_row_ = local_4b8;
        std::vector<double,_std::allocator<double>_>::resize(&lp->row_lower_,__new_size_00);
        std::vector<double,_std::allocator<double>_>::resize(&lp->row_upper_,__new_size_00);
        if (pbVar4 != pbVar5) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(&lp->row_names_,__new_size_00);
        }
        iVar2 = ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lp->num_row_];
        local_4bc = 0;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  (&a_count,(long)lp->num_col_,&local_4bc);
        lVar13 = 0;
        while (lVar13 < lp->num_row_) {
          piVar1 = ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar13;
          lVar13 = lVar13 + 1;
          for (lVar14 = (long)*piVar1;
              lVar14 < ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13]; lVar14 = lVar14 + 1) {
            a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14]] =
                 a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar14]] + 1;
          }
        }
        piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *piVar6 = 0;
        for (lVar13 = 0; lVar13 < lp->num_col_; lVar13 = lVar13 + 1) {
          piVar6[lVar13 + 1] =
               a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar13] + piVar6[lVar13];
          a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = piVar6[lVar13];
        }
        std::vector<int,_std::allocator<int>_>::resize(local_4b0,(long)iVar2);
        std::vector<double,_std::allocator<double>_>::resize(this,(long)iVar2);
        lVar13 = 0;
        while (lVar14 = lVar13, lVar14 < lp->num_row_) {
          piVar6 = (local_4b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar15 = (long)ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar14]; lVar13 = lVar14 + 1,
              lVar15 < ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14 + 1]; lVar15 = lVar15 + 1) {
            iVar2 = ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
            piVar6[a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2]] = (int)lVar14;
            iVar18 = a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2];
            pdVar8[iVar18] =
                 ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15];
            a_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar2] = iVar18 + 1;
          }
        }
        highsLogUser(log_options,kWarning,"Removed %d rows of count 1\n",
                     uVar16 + lVar17 & 0xffffffff);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&ar_value.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&ar_index.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&ar_start.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&ar_count.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&a_count.super__Vector_base<int,_std::allocator<int>_>);
        HighsLp::~HighsLp(&row_wise_lp);
        return;
      }
      iVar3 = ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13 + lVar17];
      if (ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13 + lVar17 + 1] - iVar3 != 1) break;
      iVar18 = ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      dVar19 = ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3];
      dVar20 = pdVar10[lVar13 + lVar17];
      if (dVar19 <= 0.0) {
        if (dVar20 != -INFINITY) {
          dVar21 = pdVar9[iVar18];
          if (dVar20 / dVar19 <= pdVar9[iVar18]) {
            dVar21 = dVar20 / dVar19;
          }
          pdVar9[iVar18] = dVar21;
        }
        dVar20 = pdVar11[lVar13 + lVar17];
        if (dVar20 != INFINITY) {
          dVar20 = dVar20 / dVar19;
          dVar19 = pdVar8[iVar18];
          if (pdVar8[iVar18] <= dVar20) {
            dVar19 = dVar20;
          }
          pdVar8[iVar18] = dVar19;
        }
      }
      else {
        if (dVar20 != -INFINITY) {
          dVar21 = pdVar8[iVar18];
          if (pdVar8[iVar18] <= dVar20 / dVar19) {
            dVar21 = dVar20 / dVar19;
          }
          pdVar8[iVar18] = dVar21;
        }
        dVar20 = pdVar11[lVar13 + lVar17];
        if (dVar20 != INFINITY) {
          dVar20 = dVar20 / dVar19;
          dVar19 = pdVar9[iVar18];
          if (dVar20 <= pdVar9[iVar18]) {
            dVar19 = dVar20;
          }
          pdVar9[iVar18] = dVar19;
        }
      }
      lVar17 = lVar17 + 1;
    }
    pdVar8 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8[__new_size_00] = pdVar8[lVar13 + lVar17];
    pdVar8 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8[__new_size_00] = pdVar8[lVar13 + lVar17];
    if (pbVar4 != pbVar5) {
      std::__cxx11::string::_M_assign
                ((string *)
                 ((lp->row_names_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + __new_size_00));
    }
    local_4b4 = uVar12 + (int)lVar17;
    ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [__new_size_00] = iVar18;
    lVar14 = (long)iVar18;
    for (lVar15 = (long)ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar13 + lVar17];
        lVar15 < ar_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar13 + lVar17 + 1]; lVar15 = lVar15 + 1) {
      ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar14] =
           ar_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar15];
      ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar14] =
           ar_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar15];
      lVar14 = lVar14 + 1;
    }
    local_4b8 = local_4b8 + 1;
    lVar13 = lVar13 + lVar17 + 1;
  } while( true );
}

Assistant:

void removeRowsOfCountOne(const HighsLogOptions& log_options, HighsLp& lp) {
  HighsLp row_wise_lp = lp;
  vector<HighsInt>& a_start = lp.a_matrix_.start_;
  vector<HighsInt>& a_index = lp.a_matrix_.index_;
  vector<double>& a_value = lp.a_matrix_.value_;
  vector<HighsInt> a_count;
  vector<HighsInt> ar_count;
  vector<HighsInt> ar_start;
  vector<HighsInt> ar_index;
  vector<double> ar_value;
  const bool has_name = lp.row_names_.size() > 0;
  HighsInt num_nz = a_start[lp.num_col_];
  const HighsInt original_num_nz = num_nz;
  const HighsInt original_num_row = lp.num_row_;
  HighsInt num_row_count_1 = 0;
  ar_count.assign(lp.num_row_, 0);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++)
      ar_count[a_index[iEl]]++;
  }
  ar_start.push_back(0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ar_start.push_back(ar_start[iRow] + ar_count[iRow]);
    ar_count[iRow] = ar_start[iRow];
  }
  ar_index.resize(num_nz);
  ar_value.resize(num_nz);
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    for (HighsInt iEl = a_start[iCol]; iEl < a_start[iCol + 1]; iEl++) {
      HighsInt iRow = a_index[iEl];
      ar_index[ar_count[iRow]] = iCol;
      ar_value[ar_count[iRow]] = a_value[iEl];
      ar_count[iRow]++;
    }
  }
  HighsInt newRow = 0;
  HighsInt newEl = 0;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    const HighsInt row_count = ar_start[iRow + 1] - ar_start[iRow];
    if (row_count == 1) {
      HighsInt iCol = ar_index[ar_start[iRow]];
      double value = ar_value[ar_start[iRow]];
      assert(value);
      if (value > 0) {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_lower_[iRow] / value, lp.col_lower_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_upper_[iRow] / value, lp.col_upper_[iCol]);
      } else {
        if (lp.row_lower_[iRow] > -kHighsInf)
          lp.col_upper_[iCol] =
              std::min(lp.row_lower_[iRow] / value, lp.col_upper_[iCol]);
        if (lp.row_upper_[iRow] < kHighsInf)
          lp.col_lower_[iCol] =
              std::max(lp.row_upper_[iRow] / value, lp.col_lower_[iCol]);
      }
      num_row_count_1++;
      continue;
    }
    lp.row_lower_[newRow] = lp.row_lower_[iRow];
    lp.row_upper_[newRow] = lp.row_upper_[iRow];
    if (has_name) lp.row_names_[newRow] = lp.row_names_[iRow];
    ar_start[newRow] = newEl;
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      ar_index[newEl] = ar_index[iEl];
      ar_value[newEl] = ar_value[iEl];
      newEl++;
    }
    newRow++;
  }
  ar_start[newRow] = newEl;
  lp.num_row_ = newRow;
  lp.row_lower_.resize(newRow);
  lp.row_upper_.resize(newRow);
  if (has_name) lp.row_names_.resize(newRow);

  num_nz = ar_start[lp.num_row_];
  a_count.assign(lp.num_col_, 0);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++)
      a_count[ar_index[iEl]]++;
  }
  a_start[0] = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    a_start[iCol + 1] = a_start[iCol] + a_count[iCol];
    a_count[iCol] = a_start[iCol];
  }
  a_index.resize(num_nz);
  a_value.resize(num_nz);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    for (HighsInt iEl = ar_start[iRow]; iEl < ar_start[iRow + 1]; iEl++) {
      HighsInt iCol = ar_index[iEl];
      a_index[a_count[iCol]] = iRow;
      a_value[a_count[iCol]] = ar_value[iEl];
      a_count[iCol]++;
    }
  }
  assert(original_num_row - lp.num_row_ == num_row_count_1);
  assert(original_num_nz - num_nz == num_row_count_1);
  highsLogUser(log_options, HighsLogType::kWarning,
               "Removed %d rows of count 1\n", (int)num_row_count_1);
}